

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkformat_str.c
# Opt level: O3

int ktx_strcasecmp(char *s1,char *s2)

{
  __int32_t *p_Var1;
  int iVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  pp_Var3 = __ctype_tolower_loc();
  p_Var1 = *pp_Var3;
  uVar4 = (ulong)(byte)*s1;
  iVar2 = p_Var1[uVar4];
  iVar6 = p_Var1[(byte)*s2];
  if (iVar2 == iVar6) {
    lVar5 = 1;
    do {
      if ((char)uVar4 == '\0') {
        return 0;
      }
      uVar4 = (ulong)(byte)s1[lVar5];
      iVar2 = p_Var1[uVar4];
      iVar6 = p_Var1[(byte)s2[lVar5]];
      lVar5 = lVar5 + 1;
    } while (iVar2 == iVar6);
  }
  return iVar2 - iVar6;
}

Assistant:

static int ktx_strcasecmp(const char* s1, const char* s2) {
    const unsigned char* us1 = (const unsigned char*) s1;
    const unsigned char* us2 = (const unsigned char*) s2;

    while (tolower(*us1) == tolower(*us2)) {
        if (*us1 == '\0')
            return 0;
        ++us1;
        ++us2;
    }
    return tolower(*us1) - tolower(*us2);
}